

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impute.hpp
# Opt level: O3

void check_for_missing<ImputedData<long,long_double>,InputData<float,long>>
               (InputData<float,_long> *input_data,
               vector<ImputedData<long,_long_double>,_std::allocator<ImputedData<long,_long_double>_>_>
               *impute_vec,
               robin_map<unsigned_long,_ImputedData<long,_long_double>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_ImputedData<long,_long_double>_>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
               *impute_map,int nthreads)

{
  vector<char,_std::allocator<char>_> *this;
  pointer pcVar1;
  long *plVar2;
  long lVar3;
  size_t sVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint *puVar10;
  int *piVar11;
  value_type_conflict5 local_29;
  
  this = &input_data->has_missing;
  local_29 = '\0';
  std::vector<char,_std::allocator<char>_>::_M_fill_assign(this,input_data->nrows,&local_29);
  plVar2 = input_data->Xc_indptr;
  if ((plVar2 != (long *)0x0) && (uVar8 = input_data->ncols_numeric, uVar8 != 0)) {
    uVar7 = 0;
    do {
      uVar9 = plVar2[uVar7];
      uVar6 = uVar7 + 1;
      if (uVar9 < (ulong)plVar2[uVar7 + 1]) {
        do {
          if (0x7f7fffff < (uint)ABS(input_data->Xc[uVar9])) {
            (input_data->has_missing).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start[input_data->Xc_ind[uVar9]] = '\x01';
            plVar2 = input_data->Xc_indptr;
          }
          uVar9 = uVar9 + 1;
        } while (uVar9 < (ulong)plVar2[uVar6]);
        uVar8 = input_data->ncols_numeric;
      }
      uVar7 = uVar6;
    } while (uVar6 < uVar8);
  }
  if ((input_data->categ_data != (int *)0x0 || input_data->numeric_data != (float *)0x0) &&
     (uVar8 = input_data->nrows, uVar8 != 0)) {
    lVar3 = 0;
    uVar7 = 0;
    do {
      if ((input_data->Xc_indptr == (long *)0x0) && (sVar4 = input_data->ncols_numeric, sVar4 != 0))
      {
        puVar10 = (uint *)((long)input_data->numeric_data + lVar3);
        do {
          if (0x7f7fffff < (*puVar10 & 0x7fffffff)) {
            (this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
            _M_start[uVar7] = '\x01';
            break;
          }
          puVar10 = puVar10 + uVar8;
          sVar4 = sVar4 - 1;
        } while (sVar4 != 0);
      }
      pcVar1 = (this->super__Vector_base<char,_std::allocator<char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((pcVar1[uVar7] == '\0') && (sVar4 = input_data->ncols_categ, sVar4 != 0)) {
        piVar11 = (int *)((long)input_data->categ_data + lVar3);
        do {
          if (*piVar11 < 0) {
            pcVar1[uVar7] = '\x01';
            break;
          }
          piVar11 = piVar11 + input_data->nrows;
          sVar4 = sVar4 - 1;
        } while (sVar4 != 0);
      }
      uVar7 = uVar7 + 1;
      uVar8 = input_data->nrows;
      lVar3 = lVar3 + 4;
    } while (uVar7 < uVar8);
  }
  sVar4 = 0;
  for (pcVar5 = (input_data->has_missing).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start;
      pcVar5 != (input_data->has_missing).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish; pcVar5 = pcVar5 + 1) {
    sVar4 = sVar4 + (long)*pcVar5;
  }
  input_data->n_missing = sVar4;
  allocate_imp<ImputedData<long,long_double>,InputData<float,long>>
            (input_data,impute_vec,impute_map,nthreads);
  return;
}

Assistant:

void check_for_missing(InputData &input_data,
                       std::vector<ImputedData> &impute_vec,
                       hashed_map<size_t, ImputedData> &impute_map,
                       int nthreads)
{
    input_data.has_missing.assign(input_data.nrows, false);

    if (input_data.Xc_indptr != NULL)
    {
        for (size_t col = 0; col < input_data.ncols_numeric; col++)
            #pragma omp parallel for schedule(static) num_threads(nthreads) shared(col, input_data)
            for (size_t_for ix = input_data.Xc_indptr[col]; ix < (decltype(ix))input_data.Xc_indptr[col + 1]; ix++)
                if (is_na_or_inf(input_data.Xc[ix]))
                    input_data.has_missing[input_data.Xc_ind[ix]] = true;
            #pragma omp barrier
    }

    if (input_data.numeric_data != NULL || input_data.categ_data != NULL)
    {
        #pragma omp parallel for schedule(static) num_threads(nthreads) shared(input_data)
        for (size_t_for row = 0; row < (decltype(row))input_data.nrows; row++)
        {
            if (input_data.Xc_indptr == NULL)
            {
                for (size_t col = 0; col < input_data.ncols_numeric; col++)
                {
                    if (is_na_or_inf(input_data.numeric_data[row + col * input_data.nrows]))
                    {
                        input_data.has_missing[row] = true;
                        break;
                    }
                }
            }

            if (!input_data.has_missing[row])
                for (size_t col = 0; col < input_data.ncols_categ; col++)
                {
                    if (input_data.categ_data[row + col * input_data.nrows] < 0)
                    {
                        input_data.has_missing[row] = true;
                        break;
                    }
                }
        }
    }

    input_data.n_missing = std::accumulate(input_data.has_missing.begin(), input_data.has_missing.end(), (size_t)0);
    allocate_imp(input_data, impute_vec, impute_map, nthreads);
}